

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_algorithm.h
# Opt level: O0

void ezy::experimental::detail::
     tuple_zip_for_each_helper<std::tuple<int,unsigned_int,int>const&,std::tuple<char,char,char>const&,____C_A_T_C_H____T_E_S_T____274()::__0,0ul,1ul,2ul>
               (tuple<int,_unsigned_int,_int> *t1,tuple<char,_char,_char> *t2,
               anon_class_8_1_6971b95b *fn)

{
  __tuple_element_t<0UL,_tuple<int,_unsigned_int,_int>_> *args;
  __tuple_element_t<0UL,_tuple<char,_char,_char>_> *args_1;
  __tuple_element_t<1UL,_tuple<int,_unsigned_int,_int>_> *args_00;
  __tuple_element_t<1UL,_tuple<char,_char,_char>_> *args_1_00;
  __tuple_element_t<2UL,_tuple<int,_unsigned_int,_int>_> *args_01;
  __tuple_element_t<2UL,_tuple<char,_char,_char>_> *args_1_01;
  anon_class_8_1_6971b95b *fn_local;
  tuple<char,_char,_char> *t2_local;
  tuple<int,_unsigned_int,_int> *t1_local;
  
  args = std::get<0ul,int,unsigned_int,int>(t1);
  args_1 = std::get<0ul,char,char,char>(t2);
  invoke<____C_A_T_C_H____T_E_S_T____274()::__0,int_const&,char_const&>(fn,args,args_1);
  args_00 = std::get<1ul,int,unsigned_int,int>(t1);
  args_1_00 = std::get<1ul,char,char,char>(t2);
  invoke<____C_A_T_C_H____T_E_S_T____274()::__0,unsigned_int_const&,char_const&>
            (fn,args_00,args_1_00);
  args_01 = std::get<2ul,int,unsigned_int,int>(t1);
  args_1_01 = std::get<2ul,char,char,char>(t2);
  invoke<____C_A_T_C_H____T_E_S_T____274()::__0,int_const&,char_const&>(fn,args_01,args_1_01);
  return;
}

Assistant:

constexpr auto tuple_zip_for_each_helper(Tuple1&& t1, Tuple2&& t2, Fn&& fn, std::index_sequence<Is...>)
    {
      (
        ezy::invoke(
          std::forward<Fn>(fn),
          std::get<Is>(std::forward<Tuple1>(t1)),
          std::get<Is>(std::forward<Tuple2>(t2))
        ), ...
      );
    }